

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

_Bool tcg_op_supported_ppc(TCGOpcode op)

{
  byte local_2a;
  _Bool have_vec;
  TCGOpcode op_local;
  
  have_vec = have_avx1_ppc || have_avx2_ppc;
  switch(op) {
  case INDEX_op_discard:
  case INDEX_op_set_label:
  case INDEX_op_call:
  case INDEX_op_br:
  case INDEX_op_mb:
  case INDEX_op_insn_start:
  case INDEX_op_exit_tb:
  case INDEX_op_goto_tb:
  case INDEX_op_qemu_ld_i32:
  case INDEX_op_qemu_st_i32:
  case INDEX_op_qemu_ld_i64:
  case INDEX_op_qemu_st_i64:
    have_vec = true;
    break;
  case INDEX_op_mov_i32:
  case INDEX_op_movi_i32:
  case INDEX_op_setcond_i32:
  case INDEX_op_ld8u_i32:
  case INDEX_op_ld8s_i32:
  case INDEX_op_ld16u_i32:
  case INDEX_op_ld16s_i32:
  case INDEX_op_ld_i32:
  case INDEX_op_st8_i32:
  case INDEX_op_st16_i32:
  case INDEX_op_st_i32:
  case INDEX_op_add_i32:
  case INDEX_op_sub_i32:
  case INDEX_op_mul_i32:
  case INDEX_op_and_i32:
  case INDEX_op_or_i32:
  case INDEX_op_xor_i32:
  case INDEX_op_shl_i32:
  case INDEX_op_shr_i32:
  case INDEX_op_sar_i32:
  case INDEX_op_brcond_i32:
    have_vec = true;
    break;
  case INDEX_op_movcond_i32:
    have_vec = true;
    break;
  case INDEX_op_div_i32:
  case INDEX_op_divu_i32:
    have_vec = false;
    break;
  case INDEX_op_rem_i32:
  case INDEX_op_remu_i32:
    have_vec = false;
    break;
  case INDEX_op_div2_i32:
  case INDEX_op_divu2_i32:
    have_vec = true;
    break;
  case INDEX_op_rotl_i32:
  case INDEX_op_rotr_i32:
    have_vec = true;
    break;
  case INDEX_op_deposit_i32:
    have_vec = true;
    break;
  case INDEX_op_extract_i32:
    have_vec = true;
    break;
  case INDEX_op_sextract_i32:
    have_vec = true;
    break;
  case INDEX_op_extract2_i32:
    have_vec = true;
    break;
  case INDEX_op_add2_i32:
    have_vec = true;
    break;
  case INDEX_op_sub2_i32:
    have_vec = true;
    break;
  case INDEX_op_mulu2_i32:
    have_vec = true;
    break;
  case INDEX_op_muls2_i32:
    have_vec = true;
    break;
  case INDEX_op_muluh_i32:
    have_vec = false;
    break;
  case INDEX_op_mulsh_i32:
    have_vec = false;
    break;
  case INDEX_op_brcond2_i32:
  case INDEX_op_setcond2_i32:
    have_vec = false;
    break;
  case INDEX_op_ext8s_i32:
    have_vec = true;
    break;
  case INDEX_op_ext16s_i32:
    have_vec = true;
    break;
  case INDEX_op_ext8u_i32:
    have_vec = true;
    break;
  case INDEX_op_ext16u_i32:
    have_vec = true;
    break;
  case INDEX_op_bswap16_i32:
    have_vec = true;
    break;
  case INDEX_op_bswap32_i32:
    have_vec = true;
    break;
  case INDEX_op_not_i32:
    have_vec = true;
    break;
  case INDEX_op_neg_i32:
    have_vec = true;
    break;
  case INDEX_op_andc_i32:
    have_vec = have_bmi1_ppc;
    break;
  case INDEX_op_orc_i32:
    have_vec = false;
    break;
  case INDEX_op_eqv_i32:
    have_vec = false;
    break;
  case INDEX_op_nand_i32:
    have_vec = false;
    break;
  case INDEX_op_nor_i32:
    have_vec = false;
    break;
  case INDEX_op_clz_i32:
    have_vec = true;
    break;
  case INDEX_op_ctz_i32:
    have_vec = true;
    break;
  case INDEX_op_ctpop_i32:
    have_vec = have_popcnt_ppc;
    break;
  case INDEX_op_mov_i64:
  case INDEX_op_movi_i64:
  case INDEX_op_setcond_i64:
  case INDEX_op_ld8u_i64:
  case INDEX_op_ld8s_i64:
  case INDEX_op_ld16u_i64:
  case INDEX_op_ld16s_i64:
  case INDEX_op_ld32u_i64:
  case INDEX_op_ld32s_i64:
  case INDEX_op_ld_i64:
  case INDEX_op_st8_i64:
  case INDEX_op_st16_i64:
  case INDEX_op_st32_i64:
  case INDEX_op_st_i64:
  case INDEX_op_add_i64:
  case INDEX_op_sub_i64:
  case INDEX_op_mul_i64:
  case INDEX_op_and_i64:
  case INDEX_op_or_i64:
  case INDEX_op_xor_i64:
  case INDEX_op_shl_i64:
  case INDEX_op_shr_i64:
  case INDEX_op_sar_i64:
  case INDEX_op_ext_i32_i64:
  case INDEX_op_extu_i32_i64:
  case INDEX_op_brcond_i64:
    have_vec = true;
    break;
  case INDEX_op_movcond_i64:
    have_vec = true;
    break;
  case INDEX_op_div_i64:
  case INDEX_op_divu_i64:
    have_vec = false;
    break;
  case INDEX_op_rem_i64:
  case INDEX_op_remu_i64:
    have_vec = false;
    break;
  case INDEX_op_div2_i64:
  case INDEX_op_divu2_i64:
    have_vec = true;
    break;
  case INDEX_op_rotl_i64:
  case INDEX_op_rotr_i64:
    have_vec = true;
    break;
  case INDEX_op_deposit_i64:
    have_vec = true;
    break;
  case INDEX_op_extract_i64:
    have_vec = true;
    break;
  case INDEX_op_sextract_i64:
    have_vec = false;
    break;
  case INDEX_op_extract2_i64:
    have_vec = true;
    break;
  case INDEX_op_extrl_i64_i32:
    have_vec = true;
    break;
  case INDEX_op_extrh_i64_i32:
    have_vec = true;
    break;
  case INDEX_op_ext8s_i64:
    have_vec = true;
    break;
  case INDEX_op_ext16s_i64:
    have_vec = true;
    break;
  case INDEX_op_ext32s_i64:
    have_vec = true;
    break;
  case INDEX_op_ext8u_i64:
    have_vec = true;
    break;
  case INDEX_op_ext16u_i64:
    have_vec = true;
    break;
  case INDEX_op_ext32u_i64:
    have_vec = true;
    break;
  case INDEX_op_bswap16_i64:
    have_vec = true;
    break;
  case INDEX_op_bswap32_i64:
    have_vec = true;
    break;
  case INDEX_op_bswap64_i64:
    have_vec = true;
    break;
  case INDEX_op_not_i64:
    have_vec = true;
    break;
  case INDEX_op_neg_i64:
    have_vec = true;
    break;
  case INDEX_op_andc_i64:
    have_vec = have_bmi1_ppc;
    break;
  case INDEX_op_orc_i64:
    have_vec = false;
    break;
  case INDEX_op_eqv_i64:
    have_vec = false;
    break;
  case INDEX_op_nand_i64:
    have_vec = false;
    break;
  case INDEX_op_nor_i64:
    have_vec = false;
    break;
  case INDEX_op_clz_i64:
    have_vec = true;
    break;
  case INDEX_op_ctz_i64:
    have_vec = true;
    break;
  case INDEX_op_ctpop_i64:
    have_vec = have_popcnt_ppc;
    break;
  case INDEX_op_add2_i64:
    have_vec = true;
    break;
  case INDEX_op_sub2_i64:
    have_vec = true;
    break;
  case INDEX_op_mulu2_i64:
    have_vec = true;
    break;
  case INDEX_op_muls2_i64:
    have_vec = true;
    break;
  case INDEX_op_muluh_i64:
    have_vec = false;
    break;
  case INDEX_op_mulsh_i64:
    have_vec = false;
    break;
  case INDEX_op_goto_ptr:
    have_vec = true;
    break;
  case INDEX_op_mov_vec:
  case INDEX_op_dupi_vec:
  case INDEX_op_dup_vec:
  case INDEX_op_ld_vec:
  case INDEX_op_st_vec:
  case INDEX_op_dupm_vec:
  case INDEX_op_add_vec:
  case INDEX_op_sub_vec:
  case INDEX_op_and_vec:
  case INDEX_op_or_vec:
  case INDEX_op_xor_vec:
  case INDEX_op_cmp_vec:
    break;
  case INDEX_op_dup2_vec:
    have_vec = false;
    break;
  case INDEX_op_mul_vec:
    break;
  case INDEX_op_neg_vec:
    have_vec = false;
    break;
  case INDEX_op_abs_vec:
    break;
  case INDEX_op_ssadd_vec:
  case INDEX_op_usadd_vec:
  case INDEX_op_sssub_vec:
  case INDEX_op_ussub_vec:
    break;
  case INDEX_op_smin_vec:
  case INDEX_op_umin_vec:
  case INDEX_op_smax_vec:
  case INDEX_op_umax_vec:
    break;
  case INDEX_op_andc_vec:
    break;
  case INDEX_op_orc_vec:
    have_vec = false;
    break;
  case INDEX_op_not_vec:
    have_vec = false;
    break;
  case INDEX_op_shli_vec:
  case INDEX_op_shri_vec:
  case INDEX_op_sari_vec:
    break;
  case INDEX_op_shls_vec:
  case INDEX_op_shrs_vec:
  case INDEX_op_sars_vec:
    break;
  case INDEX_op_shlv_vec:
  case INDEX_op_shrv_vec:
  case INDEX_op_sarv_vec:
    local_2a = 0;
    if (have_vec) {
      local_2a = have_avx2_ppc;
    }
    have_vec = (_Bool)(local_2a & 1);
    break;
  case INDEX_op_bitsel_vec:
    have_vec = false;
    break;
  case INDEX_op_cmpsel_vec:
    break;
  default:
    have_vec = true;
  }
  return have_vec;
}

Assistant:

bool tcg_op_supported(TCGOpcode op)
{
    const bool have_vec
        = TCG_TARGET_HAS_v64 | TCG_TARGET_HAS_v128 | TCG_TARGET_HAS_v256;

    switch (op) {
    case INDEX_op_discard:
    case INDEX_op_set_label:
    case INDEX_op_call:
    case INDEX_op_br:
    case INDEX_op_mb:
    case INDEX_op_insn_start:
    case INDEX_op_exit_tb:
    case INDEX_op_goto_tb:
    case INDEX_op_qemu_ld_i32:
    case INDEX_op_qemu_st_i32:
    case INDEX_op_qemu_ld_i64:
    case INDEX_op_qemu_st_i64:
        return true;

    case INDEX_op_goto_ptr:
        return TCG_TARGET_HAS_goto_ptr;

    case INDEX_op_mov_i32:
    case INDEX_op_movi_i32:
    case INDEX_op_setcond_i32:
    case INDEX_op_brcond_i32:
    case INDEX_op_ld8u_i32:
    case INDEX_op_ld8s_i32:
    case INDEX_op_ld16u_i32:
    case INDEX_op_ld16s_i32:
    case INDEX_op_ld_i32:
    case INDEX_op_st8_i32:
    case INDEX_op_st16_i32:
    case INDEX_op_st_i32:
    case INDEX_op_add_i32:
    case INDEX_op_sub_i32:
    case INDEX_op_mul_i32:
    case INDEX_op_and_i32:
    case INDEX_op_or_i32:
    case INDEX_op_xor_i32:
    case INDEX_op_shl_i32:
    case INDEX_op_shr_i32:
    case INDEX_op_sar_i32:
        return true;

    case INDEX_op_movcond_i32:
        return TCG_TARGET_HAS_movcond_i32;
    case INDEX_op_div_i32:
    case INDEX_op_divu_i32:
        return TCG_TARGET_HAS_div_i32;
    case INDEX_op_rem_i32:
    case INDEX_op_remu_i32:
        return TCG_TARGET_HAS_rem_i32;
    case INDEX_op_div2_i32:
    case INDEX_op_divu2_i32:
        return TCG_TARGET_HAS_div2_i32;
    case INDEX_op_rotl_i32:
    case INDEX_op_rotr_i32:
        return TCG_TARGET_HAS_rot_i32;
    case INDEX_op_deposit_i32:
        return TCG_TARGET_HAS_deposit_i32;
    case INDEX_op_extract_i32:
        return TCG_TARGET_HAS_extract_i32;
    case INDEX_op_sextract_i32:
        return TCG_TARGET_HAS_sextract_i32;
    case INDEX_op_extract2_i32:
        return TCG_TARGET_HAS_extract2_i32;
    case INDEX_op_add2_i32:
        return TCG_TARGET_HAS_add2_i32;
    case INDEX_op_sub2_i32:
        return TCG_TARGET_HAS_sub2_i32;
    case INDEX_op_mulu2_i32:
        return TCG_TARGET_HAS_mulu2_i32;
    case INDEX_op_muls2_i32:
        return TCG_TARGET_HAS_muls2_i32;
    case INDEX_op_muluh_i32:
        return TCG_TARGET_HAS_muluh_i32;
    case INDEX_op_mulsh_i32:
        return TCG_TARGET_HAS_mulsh_i32;
    case INDEX_op_ext8s_i32:
        return TCG_TARGET_HAS_ext8s_i32;
    case INDEX_op_ext16s_i32:
        return TCG_TARGET_HAS_ext16s_i32;
    case INDEX_op_ext8u_i32:
        return TCG_TARGET_HAS_ext8u_i32;
    case INDEX_op_ext16u_i32:
        return TCG_TARGET_HAS_ext16u_i32;
    case INDEX_op_bswap16_i32:
        return TCG_TARGET_HAS_bswap16_i32;
    case INDEX_op_bswap32_i32:
        return TCG_TARGET_HAS_bswap32_i32;
    case INDEX_op_not_i32:
        return TCG_TARGET_HAS_not_i32;
    case INDEX_op_neg_i32:
        return TCG_TARGET_HAS_neg_i32;
    case INDEX_op_andc_i32:
        return TCG_TARGET_HAS_andc_i32;
    case INDEX_op_orc_i32:
        return TCG_TARGET_HAS_orc_i32;
    case INDEX_op_eqv_i32:
        return TCG_TARGET_HAS_eqv_i32;
    case INDEX_op_nand_i32:
        return TCG_TARGET_HAS_nand_i32;
    case INDEX_op_nor_i32:
        return TCG_TARGET_HAS_nor_i32;
    case INDEX_op_clz_i32:
        return TCG_TARGET_HAS_clz_i32;
    case INDEX_op_ctz_i32:
        return TCG_TARGET_HAS_ctz_i32;
    case INDEX_op_ctpop_i32:
        return TCG_TARGET_HAS_ctpop_i32;

    case INDEX_op_brcond2_i32:
    case INDEX_op_setcond2_i32:
        return TCG_TARGET_REG_BITS == 32;

    case INDEX_op_mov_i64:
    case INDEX_op_movi_i64:
    case INDEX_op_setcond_i64:
    case INDEX_op_brcond_i64:
    case INDEX_op_ld8u_i64:
    case INDEX_op_ld8s_i64:
    case INDEX_op_ld16u_i64:
    case INDEX_op_ld16s_i64:
    case INDEX_op_ld32u_i64:
    case INDEX_op_ld32s_i64:
    case INDEX_op_ld_i64:
    case INDEX_op_st8_i64:
    case INDEX_op_st16_i64:
    case INDEX_op_st32_i64:
    case INDEX_op_st_i64:
    case INDEX_op_add_i64:
    case INDEX_op_sub_i64:
    case INDEX_op_mul_i64:
    case INDEX_op_and_i64:
    case INDEX_op_or_i64:
    case INDEX_op_xor_i64:
    case INDEX_op_shl_i64:
    case INDEX_op_shr_i64:
    case INDEX_op_sar_i64:
    case INDEX_op_ext_i32_i64:
    case INDEX_op_extu_i32_i64:
        return TCG_TARGET_REG_BITS == 64;

    case INDEX_op_movcond_i64:
        return TCG_TARGET_HAS_movcond_i64;
    case INDEX_op_div_i64:
    case INDEX_op_divu_i64:
        return TCG_TARGET_HAS_div_i64;
    case INDEX_op_rem_i64:
    case INDEX_op_remu_i64:
        return TCG_TARGET_HAS_rem_i64;
    case INDEX_op_div2_i64:
    case INDEX_op_divu2_i64:
        return TCG_TARGET_HAS_div2_i64;
    case INDEX_op_rotl_i64:
    case INDEX_op_rotr_i64:
        return TCG_TARGET_HAS_rot_i64;
    case INDEX_op_deposit_i64:
        return TCG_TARGET_HAS_deposit_i64;
    case INDEX_op_extract_i64:
        return TCG_TARGET_HAS_extract_i64;
    case INDEX_op_sextract_i64:
        return TCG_TARGET_HAS_sextract_i64;
    case INDEX_op_extract2_i64:
        return TCG_TARGET_HAS_extract2_i64;
    case INDEX_op_extrl_i64_i32:
        return TCG_TARGET_HAS_extrl_i64_i32;
    case INDEX_op_extrh_i64_i32:
        return TCG_TARGET_HAS_extrh_i64_i32;
    case INDEX_op_ext8s_i64:
        return TCG_TARGET_HAS_ext8s_i64;
    case INDEX_op_ext16s_i64:
        return TCG_TARGET_HAS_ext16s_i64;
    case INDEX_op_ext32s_i64:
        return TCG_TARGET_HAS_ext32s_i64;
    case INDEX_op_ext8u_i64:
        return TCG_TARGET_HAS_ext8u_i64;
    case INDEX_op_ext16u_i64:
        return TCG_TARGET_HAS_ext16u_i64;
    case INDEX_op_ext32u_i64:
        return TCG_TARGET_HAS_ext32u_i64;
    case INDEX_op_bswap16_i64:
        return TCG_TARGET_HAS_bswap16_i64;
    case INDEX_op_bswap32_i64:
        return TCG_TARGET_HAS_bswap32_i64;
    case INDEX_op_bswap64_i64:
        return TCG_TARGET_HAS_bswap64_i64;
    case INDEX_op_not_i64:
        return TCG_TARGET_HAS_not_i64;
    case INDEX_op_neg_i64:
        return TCG_TARGET_HAS_neg_i64;
    case INDEX_op_andc_i64:
        return TCG_TARGET_HAS_andc_i64;
    case INDEX_op_orc_i64:
        return TCG_TARGET_HAS_orc_i64;
    case INDEX_op_eqv_i64:
        return TCG_TARGET_HAS_eqv_i64;
    case INDEX_op_nand_i64:
        return TCG_TARGET_HAS_nand_i64;
    case INDEX_op_nor_i64:
        return TCG_TARGET_HAS_nor_i64;
    case INDEX_op_clz_i64:
        return TCG_TARGET_HAS_clz_i64;
    case INDEX_op_ctz_i64:
        return TCG_TARGET_HAS_ctz_i64;
    case INDEX_op_ctpop_i64:
        return TCG_TARGET_HAS_ctpop_i64;
    case INDEX_op_add2_i64:
        return TCG_TARGET_HAS_add2_i64;
    case INDEX_op_sub2_i64:
        return TCG_TARGET_HAS_sub2_i64;
    case INDEX_op_mulu2_i64:
        return TCG_TARGET_HAS_mulu2_i64;
    case INDEX_op_muls2_i64:
        return TCG_TARGET_HAS_muls2_i64;
    case INDEX_op_muluh_i64:
        return TCG_TARGET_HAS_muluh_i64;
    case INDEX_op_mulsh_i64:
        return TCG_TARGET_HAS_mulsh_i64;

    case INDEX_op_mov_vec:
    case INDEX_op_dup_vec:
    case INDEX_op_dupi_vec:
    case INDEX_op_dupm_vec:
    case INDEX_op_ld_vec:
    case INDEX_op_st_vec:
    case INDEX_op_add_vec:
    case INDEX_op_sub_vec:
    case INDEX_op_and_vec:
    case INDEX_op_or_vec:
    case INDEX_op_xor_vec:
    case INDEX_op_cmp_vec:
        return have_vec;
    case INDEX_op_dup2_vec:
        return have_vec && TCG_TARGET_REG_BITS == 32;
    case INDEX_op_not_vec:
        return have_vec && TCG_TARGET_HAS_not_vec;
    case INDEX_op_neg_vec:
        return have_vec && TCG_TARGET_HAS_neg_vec;
    case INDEX_op_abs_vec:
        return have_vec && TCG_TARGET_HAS_abs_vec;
    case INDEX_op_andc_vec:
        return have_vec && TCG_TARGET_HAS_andc_vec;
    case INDEX_op_orc_vec:
        return have_vec && TCG_TARGET_HAS_orc_vec;
    case INDEX_op_mul_vec:
        return have_vec && TCG_TARGET_HAS_mul_vec;
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
    case INDEX_op_sari_vec:
        return have_vec && TCG_TARGET_HAS_shi_vec;
    case INDEX_op_shls_vec:
    case INDEX_op_shrs_vec:
    case INDEX_op_sars_vec:
        return have_vec && TCG_TARGET_HAS_shs_vec;
    case INDEX_op_shlv_vec:
    case INDEX_op_shrv_vec:
    case INDEX_op_sarv_vec:
        return have_vec && TCG_TARGET_HAS_shv_vec;
    case INDEX_op_ssadd_vec:
    case INDEX_op_usadd_vec:
    case INDEX_op_sssub_vec:
    case INDEX_op_ussub_vec:
        return have_vec && TCG_TARGET_HAS_sat_vec;
    case INDEX_op_smin_vec:
    case INDEX_op_umin_vec:
    case INDEX_op_smax_vec:
    case INDEX_op_umax_vec:
        return have_vec && TCG_TARGET_HAS_minmax_vec;
    case INDEX_op_bitsel_vec:
        return have_vec && TCG_TARGET_HAS_bitsel_vec;
    case INDEX_op_cmpsel_vec:
        return have_vec && TCG_TARGET_HAS_cmpsel_vec;

    default:
        tcg_debug_assert(op > INDEX_op_last_generic && op < NB_OPS);
        return true;
    }
}